

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O1

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)3>::run_for
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)3> *this)

{
  Cycles in_RSI;
  
  run_for((ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)3> *)
          &this[-1].fdc_.object_.super_i8272.drives_[2].step_rate_counter,in_RSI);
  return;
}

Assistant:

void run_for(const Cycles cycles) override {
			z80_.run_for(cycles);

			// Use this very broad timing base for the automatic enter depression.
			// It's not worth polluting the main loop.
			if(duration_to_press_enter_ > Cycles(0)) {
				if(duration_to_press_enter_ < cycles) {
					duration_to_press_enter_ = Cycles(0);
					keyboard_.set_key_state(ZX::Keyboard::KeyEnter, false);
				} else {
					duration_to_press_enter_ -= cycles;
				}
			}
		}